

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O0

void unmul(char *msg_override)

{
  _func_int *p_Var1;
  char *pcVar2;
  _func_int *saved_afternmv;
  char *msg_override_local;
  
  nomul(0,(char *)0x0);
  pcVar2 = msg_override;
  if ((msg_override == (char *)0x0) && (pcVar2 = nomovemsg, nomovemsg == (char *)0x0)) {
    nomovemsg = "You can move again.";
    pcVar2 = nomovemsg;
  }
  nomovemsg = pcVar2;
  if (*nomovemsg != '\0') {
    pline(nomovemsg);
  }
  p_Var1 = afternmv;
  nomovemsg = (char *)0x0;
  afternmv = (_func_int *)0x0;
  if (p_Var1 != (_func_int *)0x0) {
    (*p_Var1)();
  }
  return;
}

Assistant:

void unmul(const char *msg_override)
{
	int (*saved_afternmv)(void);

	nomul(0, NULL);

	if (msg_override) nomovemsg = msg_override;
	else if (!nomovemsg) nomovemsg = "You can move again.";
	if (*nomovemsg) pline(nomovemsg);
	nomovemsg = 0;

	/*
	 * Unsetting afternmv is required for donning/donning_on/donning_off()
	 * to return accurate results, so equip_is_worn() returns accurate
	 * results, so adj_abon() will do its job when the Foo_on() functions
	 * call it at the end of armor-wearing delays.
	 *
	 * P.S. I checked: no other functions rely on afternmv being set.
	 */
	saved_afternmv = afternmv;
	afternmv = NULL;
	if (saved_afternmv) (*saved_afternmv)();
}